

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

void __thiscall TGAImage::scale(TGAImage *this,size_t w,size_t h)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tdata;
  allocator_type local_82;
  value_type_conflict local_81;
  size_t local_80;
  size_t local_78;
  int local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  size_t local_40;
  long local_38;
  
  if ((h != 0 && w != 0) &&
     ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    local_81 = '\0';
    local_80 = w;
    local_78 = h;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_58,(ulong)this->bytespp * h * w,&local_81,&local_82);
    uVar1 = this->height;
    if (uVar1 != 0) {
      __n = (size_t)(int)(this->bytespp * (int)local_80);
      local_38 = (long)(int)(this->width * this->bytespp);
      lVar5 = 0;
      uVar6 = 0;
      iVar4 = 0;
      iVar8 = 0;
      local_40 = __n;
      do {
        uVar2 = this->width;
        lVar9 = (long)iVar8;
        iVar3 = (int)local_78;
        if (uVar2 != 0) {
          local_5c = -this->bytespp;
          iVar10 = uVar2 - (int)local_80;
          iVar3 = local_5c;
          local_6c = iVar8;
          local_68 = iVar4;
          local_64 = uVar6;
          uVar1 = 0;
          do {
            local_60 = uVar1;
            local_5c = local_5c + this->bytespp;
            iVar10 = iVar10 + (int)local_80;
            if ((int)uVar2 <= iVar10) {
              lVar7 = (long)local_5c;
              do {
                iVar10 = iVar10 - uVar2;
                iVar3 = iVar3 + this->bytespp;
                memcpy(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + iVar3 + lVar9,
                       (this->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7 + lVar5,(ulong)this->bytespp);
                uVar2 = this->width;
              } while ((int)uVar2 <= iVar10);
            }
            uVar1 = local_60 + 1;
          } while (local_60 + 1 < uVar2);
          uVar1 = this->height;
          iVar3 = (int)local_78;
          __n = local_40;
          iVar8 = local_6c;
          iVar4 = local_68;
          uVar6 = local_64;
        }
        iVar4 = iVar4 + iVar3;
        if ((int)uVar1 <= iVar4) {
          do {
            if (SBORROW4(iVar4,uVar1 * 2) == (int)(iVar4 + uVar1 * -2) < 0) {
              memcpy(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9 + __n,
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9,__n);
              uVar1 = this->height;
            }
            iVar4 = iVar4 - uVar1;
            lVar9 = lVar9 + __n;
          } while ((int)uVar1 <= iVar4);
          iVar8 = (int)lVar9;
        }
        lVar5 = lVar5 + local_38;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->data,&local_58);
    this->width = (uint32_t)local_80;
    this->height = (uint32_t)local_78;
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void TGAImage::scale(size_t w, size_t h)
{
    if (w <= 0 || h <= 0 || !data.size()) return;
    std::vector<std::uint8_t> tdata(w * h * bytespp, 0);
    int n_scanline = 0;
    int oscanline = 0;
    int err_y = 0;
    int n_line_bytes = w * bytespp;
    int olinebytes = width * bytespp;
    for (uint32_t j = 0; j < height; j++) {
        int errx = width - w;
        int nx = -static_cast<int>(bytespp);
        int ox = -static_cast<int>(bytespp);
        for (uint32_t i = 0; i < width; i++) {
            ox += bytespp;
            errx += w;
            while (errx >= (int)width) {
                errx -= width;
                nx += bytespp;
                memcpy(tdata.data() + n_scanline + nx, data.data() + oscanline + ox, bytespp);
            }
        }
        err_y += h;
        oscanline += olinebytes;
        while (err_y >= (int)height) {
            if (err_y >= (int)height << 1)  // it means we jump over a scanline
                memcpy(tdata.data() + n_scanline + n_line_bytes, tdata.data() + n_scanline,
                       n_line_bytes);
            err_y -= height;
            n_scanline += n_line_bytes;
        }
    }
    data = tdata;
    width = (uint32_t)w;
    height = (uint32_t)h;
}